

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::ComplexOptionType1::_InternalSerialize
          (ComplexOptionType1 *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  bool bVar2;
  int32_t iVar3;
  int iVar4;
  uint32_t *puVar5;
  uint8_t *target_00;
  RepeatedField<int> *this_00;
  const_reference piVar6;
  ComplexOptionType1 *extendee;
  UnknownFieldSet *unknown_fields;
  int local_30;
  int n;
  int i;
  uint32_t cached_has_bits;
  ComplexOptionType1 *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  ComplexOptionType1 *this_local;
  
  puVar5 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar5;
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar1 & 1) != 0) {
    iVar3 = _internal_foo(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                             (stream,iVar3,target);
  }
  if ((uVar1 & 2) != 0) {
    iVar3 = _internal_foo2(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<2>
                             (stream,iVar3,(uint8_t *)stream_local);
  }
  if ((uVar1 & 4) != 0) {
    iVar3 = _internal_foo3(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>
                             (stream,iVar3,(uint8_t *)stream_local);
  }
  local_30 = 0;
  iVar4 = _internal_foo4_size(this);
  for (; local_30 < iVar4; local_30 = local_30 + 1) {
    target_00 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    this_00 = _internal_foo4(this);
    piVar6 = google::protobuf::RepeatedField<int>::Get(this_00,local_30);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                             (4,*piVar6,target_00);
  }
  extendee = default_instance();
  stream_local = (EpsCopyOutputStream *)
                 google::protobuf::internal::ExtensionSet::_InternalSerializeAll
                           (&(this->field_0)._impl_._extensions_,(MessageLite *)extendee,
                            (uint8_t *)stream_local,stream);
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar2) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL ComplexOptionType1::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const ComplexOptionType1& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.ComplexOptionType1)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional int32 foo = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_foo(), target);
  }

  // optional int32 foo2 = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<2>(
            stream, this_._internal_foo2(), target);
  }

  // optional int32 foo3 = 3;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>(
            stream, this_._internal_foo3(), target);
  }

  // repeated int32 foo4 = 4;
  for (int i = 0, n = this_._internal_foo4_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        4, this_._internal_foo4().Get(i), target);
  }

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.ComplexOptionType1)
  return target;
}